

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void __thiscall IR::Opnd::Dump(Opnd *this,IRDumpFlags flags,Func *func)

{
  code *pcVar1;
  anon_class_24_3_b3ab7b9b function;
  IRDumpFlags flags_00;
  OpndKind OVar2;
  RegNum RVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  AddrOpndKind addressKind;
  IRType IVar7;
  uint uVar8;
  PropertyId propertyId;
  uint uVar9;
  int iVar10;
  undefined4 *puVar11;
  char16_t *pcVar12;
  char16_t *pcVar13;
  PropertySym *pPVar14;
  JITType *this_00;
  BVSparse<Memory::JitArenaAllocator> *pBVar15;
  Func *this_01;
  ObjTypeSpecFldInfo *this_02;
  JITManager *this_03;
  ThreadContext *this_04;
  PropertyRecord *this_05;
  ArrayRegOpnd *this_06;
  StackSym *pSVar16;
  StackSym *pSVar17;
  Int64ConstOpnd *pIVar18;
  IntConstOpnd *pIVar19;
  RegBVOpnd *pRVar20;
  HelperCallOpnd *pHVar21;
  FloatConstOpnd *pFVar22;
  Float32ConstOpnd *pFVar23;
  IndirOpnd *this_07;
  RegOpnd *this_08;
  RegOpnd *this_09;
  char16 *pcVar24;
  void *pvVar25;
  ListOpnd *this_10;
  LabelOpnd *this_11;
  LabelInstr *pLVar26;
  char16_t *pcVar27;
  char16_t *local_2f8;
  char16_t *local_2f0;
  char16_t *local_2e0;
  char16_t *local_2d8;
  char16_t *local_2d0;
  char16_t *local_2b0;
  byte local_2a2;
  byte local_2a1;
  LabelInstr *labelInstr;
  LabelOpnd *labelOpnd;
  undefined4 uStack_25c;
  int count;
  ListOpnd *list;
  char16 buffer [128];
  size_t BUFFER_LEN;
  INT_PTR address;
  char16_t *sign;
  int32 offset_1;
  RegOpnd *indexOpnd;
  RegOpnd *baseOpnd;
  IndirOpnd *indirOpnd;
  RegBVOpnd *regBVOpnd;
  IntConstOpnd *intConstOpnd_1;
  Int64ConstOpnd *intConstOpnd;
  ArrayRegOpnd *arrayRegOpnd;
  BVUnitT<unsigned_long> local_d8;
  SparseBVUnit _unit_1;
  BVIndex _startIndex_1;
  BVIndex _offset_1;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode_1;
  BVIndex writeGuardSymId;
  BVSparse<Memory::JitArenaAllocator> *writeGuards;
  int i_1;
  ObjTypeSpecFldInfo *propertyOpInfo;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex propertyOpId;
  BVSparse<Memory::JitArenaAllocator> *guardedPropOps;
  JITTypeHolder JStack_70;
  int i;
  PropertySymOpnd *local_68;
  PropertySymOpnd *propertySymOpnd;
  int offset;
  bool hasOffset;
  StackSym *stackSym;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  byte local_45;
  JnHelperMethod local_44;
  bool dumpValueType;
  RegOpnd *pRStack_40;
  JnHelperMethod helperMethod;
  RegOpnd *regOpnd;
  SymOpnd *symOpnd;
  FloatConstType floatValue;
  bool SimpleForm;
  Func *pFStack_20;
  bool AsmDumpMode;
  Func *func_local;
  Opnd *pOStack_10;
  IRDumpFlags flags_local;
  Opnd *this_local;
  
  func_local._4_1_ = (byte)flags;
  floatValue._7_1_ = func_local._4_1_ & 1;
  floatValue._6_1_ = (byte)((flags & IRDumpFlags_SimpleForm) >> 1);
  local_45 = ~floatValue._6_1_ & 1;
  pFStack_20 = func;
  func_local._4_4_ = flags;
  pOStack_10 = this;
  OVar2 = GetKind(this);
  switch(OVar2) {
  case OpndKindIntConst:
    pIVar19 = AsIntConstOpnd(this);
    EncodableOpnd<long>::DumpEncodable(&pIVar19->super_EncodableOpnd<long>);
    break;
  case OpndKindInt64Const:
    pIVar18 = AsInt64ConstOpnd(this);
    EncodableOpnd<long>::DumpEncodable(&pIVar18->super_EncodableOpnd<long>);
    break;
  case OpndKindFloatConst:
    pFVar22 = AsFloatConstOpnd(this);
    symOpnd = (SymOpnd *)pFVar22->m_value;
    Output::Print(L"%G",symOpnd);
    break;
  case OpndKindFloat32Const:
    pFVar23 = AsFloat32ConstOpnd(this);
    Output::Print(L"%G",(double)pFVar23->m_value);
    break;
  case OpndKindHelperCall:
    pHVar21 = AsHelperCallOpnd(this);
    local_44 = pHVar21->m_fnHelper;
    pcVar24 = GetMethodName(local_44);
    Output::Print(L"%s",pcVar24);
    break;
  case OpndKindSym:
    regOpnd = (RegOpnd *)AsSymOpnd(this);
    bVar6 = Sym::IsPropertySym(((SymOpnd *)regOpnd)->m_sym);
    flags_00 = func_local._4_4_;
    if ((bVar6) && ((floatValue._6_1_ & 1) == 0)) {
      pSVar16 = regOpnd->m_sym;
      local_48.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           SymOpnd::GetPropertyOwnerValueType((SymOpnd *)regOpnd);
      Sym::Dump(&pSVar16->super_Sym,flags_00,(ValueType)local_48.field_0);
    }
    else {
      stackSym._6_2_ = ValueType::Uninitialized.field_0;
      Sym::Dump(&regOpnd->m_sym->super_Sym,func_local._4_4_,ValueType::Uninitialized);
    }
    bVar6 = Sym::IsStackSym(&regOpnd->m_sym->super_Sym);
    if (bVar6) {
      _offset = Sym::AsStackSym(&regOpnd->m_sym->super_Sym);
      bVar6 = StackSym::IsArgSlotSym(_offset);
      if (bVar6) {
        local_2a1 = 1;
        if (_offset->m_offset == -1) {
          local_2a1 = (*(uint *)&_offset->field_0x18 >> 0xe & 1) != 0 ^ 0xff;
        }
        local_2a2 = local_2a1;
      }
      else {
        local_2a2 = _offset->m_offset != 0;
      }
      propertySymOpnd._7_1_ = local_2a2 & 1;
      if (propertySymOpnd._7_1_ != 0) {
        propertySymOpnd._0_4_ = _offset->m_offset;
        if (*(int *)&regOpnd->field_0x18 != 0) {
          if ((int)((uint)propertySymOpnd + *(int *)&regOpnd->field_0x18) <
              (int)(uint)propertySymOpnd) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                               ,0xc60,"(static_cast<int>(offset + symOpnd->m_offset) >= offset)",
                               "static_cast<int>(offset + symOpnd->m_offset) >= offset");
            if (!bVar6) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          propertySymOpnd._0_4_ = *(int *)&regOpnd->field_0x18 + (uint)propertySymOpnd;
        }
        Output::Print(L"<%d>",(ulong)(uint)propertySymOpnd);
      }
    }
    else {
      bVar6 = SymOpnd::IsPropertySymOpnd((SymOpnd *)regOpnd);
      if ((bVar6) && ((floatValue._6_1_ & 1) == 0)) {
        local_68 = AsPropertySymOpnd(&regOpnd->super_Opnd);
        Output::Print(L"<");
        bVar6 = PropertySymOpnd::HasObjTypeSpecFldInfo(local_68);
        if (bVar6) {
          uVar8 = PropertySymOpnd::GetObjTypeSpecFldId(local_68);
          bVar6 = PropertySymOpnd::IsPoly(local_68);
          if (bVar6) {
            local_2b0 = L"p";
          }
          else {
            local_2b0 = L"m";
          }
          bVar6 = PropertySymOpnd::IsLoadedFromProto(local_68);
          pcVar12 = L"";
          if (bVar6) {
            pcVar12 = L"~";
          }
          bVar6 = PropertySymOpnd::UsesFixedValue(local_68);
          pcVar13 = L"";
          if (bVar6) {
            pcVar13 = L"=";
          }
          bVar6 = PropertySymOpnd::IsBeingAdded(local_68);
          pcVar27 = L"";
          if (bVar6) {
            pcVar27 = L"+";
          }
          Output::Print(L"%u,%s%s%s%s,",(ulong)uVar8,local_2b0,pcVar12,pcVar13,pcVar27);
        }
        else {
          Output::Print(L"?,,");
        }
        bVar6 = PropertySymOpnd::MayNeedTypeCheckProtection(local_68);
        if (bVar6) {
          bVar6 = PropertySymOpnd::IsMono(local_68);
          if (bVar6) {
            local_2d0 = L"+";
          }
          else {
            local_2d0 = L"=";
          }
          local_2d8 = local_2d0;
        }
        else {
          bVar6 = PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(local_68);
          if (bVar6) {
            local_2e0 = L"Type not supported for unary ~";
          }
          else {
            local_2e0 = L"Type not supported for unary -";
          }
          local_2e0 = local_2e0 + 0x1d;
          local_2d8 = local_2e0;
        }
        bVar6 = PropertySymOpnd::IsTypeCheckSeqCandidate(local_68);
        if (bVar6) {
          local_2f0 = L"Type not supported for unary +";
        }
        else {
          local_2f0 = L"Type not supported for unary -";
        }
        local_2f0 = local_2f0 + 0x1d;
        Output::Print(L"%s%s,",local_2d8,local_2f0);
        bVar6 = PropertySymOpnd::HasObjectTypeSym(local_68);
        if (bVar6) {
          pSVar16 = PropertySymOpnd::GetObjectTypeSym(local_68);
          Output::Print(L"s%d",(ulong)(pSVar16->super_Sym).m_id);
          bVar6 = PropertySymOpnd::IsTypeChecked(local_68);
          if (bVar6) {
            bVar6 = PropertySymOpnd::IsMono(local_68);
            if (bVar6) {
              local_2f8 = L"m";
            }
            else {
              local_2f8 = L"p";
            }
            Output::Print(L"+%s",local_2f8);
          }
          else {
            bVar6 = PropertySymOpnd::IsTypeAvailable(local_68);
            if (bVar6) {
              Output::Print(L"*");
            }
          }
          bVar6 = PropertySymOpnd::IsTypeDead(local_68);
          if (bVar6) {
            Output::Print(L"!");
          }
        }
        else {
          Output::Print(L"s?");
        }
        pPVar14 = Sym::AsPropertySym((local_68->super_SymOpnd).m_sym);
        if (pPVar14->m_writeGuardSym == (PropertySym *)0x0) {
          Output::Print(L",s?");
        }
        else {
          pPVar14 = Sym::AsPropertySym((local_68->super_SymOpnd).m_sym);
          Output::Print(L",s%d",(ulong)(pPVar14->m_writeGuardSym->super_Sym).m_id);
          bVar6 = PropertySymOpnd::IsWriteGuardChecked(local_68);
          if (bVar6) {
            Output::Print(L"+");
          }
        }
        bVar6 = PropertySymOpnd::HasFinalType(local_68);
        if (bVar6) {
          Output::Print(L",final:");
          JStack_70 = PropertySymOpnd::GetFinalType(local_68);
          this_00 = JITTypeHolderBase<void>::operator->(&stack0xffffffffffffff90);
          pvVar25 = (void *)JITType::GetAddr(this_00);
          DumpAddress(pvVar25,true,false);
        }
        pBVar15 = PropertySymOpnd::GetGuardedPropOps(local_68);
        if (pBVar15 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          Output::Print(L",{");
          if (pFStack_20 == (Func *)0x0) {
            Output::Print(L"(no func)");
          }
          else {
            guardedPropOps._4_4_ = 0;
            pBVar15 = PropertySymOpnd::GetGuardedPropOps(local_68);
            for (__startIndex = pBVar15->head; __startIndex != (Type_conflict)0x0;
                __startIndex = __startIndex->next) {
              _unit.word._0_4_ = __startIndex->startIndex;
              propertyOpInfo = (ObjTypeSpecFldInfo *)(__startIndex->data).word;
              _unit.word._4_4_ =
                   BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&propertyOpInfo);
              while (_unit.word._4_4_ != 0xffffffff) {
                uVar8 = (Type)_unit.word + _unit.word._4_4_;
                BVUnitT<unsigned_long>::Clear
                          ((BVUnitT<unsigned_long> *)&propertyOpInfo,_unit.word._4_4_);
                if (0 < guardedPropOps._4_4_) {
                  Output::Print(L",");
                }
                this_01 = Func::GetTopFunc(pFStack_20);
                this_02 = Func::GetGlobalObjTypeSpecFldInfo(this_01,uVar8);
                this_03 = JITManager::GetJITManager();
                bVar6 = JITManager::IsOOPJITEnabled(this_03);
                if (!bVar6) {
                  this_04 = Func::GetInProcThreadContext(pFStack_20);
                  propertyId = ObjTypeSpecFldInfo::GetPropertyId(this_02);
                  this_05 = ThreadContext::GetPropertyRecord(this_04,propertyId);
                  pcVar24 = Js::PropertyRecord::GetBuffer(this_05);
                  Output::Print(L"%s",pcVar24,(ulong)uVar8);
                }
                Output::Print(L"(%u)",(ulong)uVar8);
                bVar6 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_02);
                if (bVar6) {
                  Output::Print(L"~");
                }
                bVar6 = ObjTypeSpecFldInfo::HasFixedValue(this_02);
                if (bVar6) {
                  Output::Print(L"=");
                }
                bVar6 = ObjTypeSpecFldInfo::IsBeingAdded(this_02);
                if (bVar6) {
                  Output::Print(L"+");
                }
                _unit.word._4_4_ =
                     BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&propertyOpInfo);
                guardedPropOps._4_4_ = guardedPropOps._4_4_ + 1;
              }
              if (__startIndex == (Type_conflict)0x0) break;
            }
          }
          Output::Print(L"}");
        }
        pBVar15 = PropertySymOpnd::GetWriteGuards(local_68);
        if (pBVar15 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          Output::Print(L",{");
          writeGuards._4_4_ = 0;
          pBVar15 = PropertySymOpnd::GetWriteGuards(local_68);
          for (__startIndex_1 = pBVar15->head; __startIndex_1 != (Type_conflict)0x0;
              __startIndex_1 = __startIndex_1->next) {
            _unit_1.word._0_4_ = __startIndex_1->startIndex;
            local_d8.word = (__startIndex_1->data).word;
            _unit_1.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit(&local_d8);
            while (_unit_1.word._4_4_ != 0xffffffff) {
              uVar9 = (Type)_unit_1.word + _unit_1.word._4_4_;
              BVUnitT<unsigned_long>::Clear(&local_d8,_unit_1.word._4_4_);
              if (0 < writeGuards._4_4_) {
                Output::Print(L",");
              }
              Output::Print(L"s%d",(ulong)uVar9);
              _unit_1.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit(&local_d8);
              writeGuards._4_4_ = writeGuards._4_4_ + 1;
            }
            if (__startIndex_1 == (Type_conflict)0x0) break;
          }
          Output::Print(L"}");
        }
        if (((byte)(local_68->super_SymOpnd).super_Opnd.field_0xb >> 4 & 1) != 0) {
          Output::Print(L",t");
        }
        Output::Print(L">");
      }
    }
    break;
  case OpndKindReg:
    pRStack_40 = AsRegOpnd(this);
    if (pRStack_40->m_sym != (StackSym *)0x0) {
      Sym::Dump(&pRStack_40->m_sym->super_Sym,func_local._4_4_,ValueType::Uninitialized);
    }
    if ((floatValue._7_1_ & 1) == 0) {
      RVar3 = RegOpnd::GetReg(pRStack_40);
      if (RVar3 != RegNOREG) {
        RVar3 = RegOpnd::GetReg(pRStack_40);
        Output::Print(L"(%S)",RegNames[RVar3]);
      }
      if ((pRStack_40->field_0x18 & 1) != 0) {
        Output::Print(L"[isTempLastUse]");
      }
      bVar6 = RegOpnd::IsArrayRegOpnd(pRStack_40);
      if (bVar6) {
        if ((local_45 & 1) != 0) {
          DumpValueType(this);
          local_45 = 0;
        }
        this_06 = RegOpnd::AsArrayRegOpnd(pRStack_40);
        pSVar16 = ArrayRegOpnd::HeadSegmentSym(this_06);
        if (pSVar16 != (StackSym *)0x0) {
          Output::Print(L"[seg: ");
          pSVar16 = ArrayRegOpnd::HeadSegmentSym(this_06);
          Sym::Dump(&pSVar16->super_Sym,ValueType::Uninitialized);
          Output::Print(L"]");
        }
        pSVar16 = ArrayRegOpnd::HeadSegmentLengthSym(this_06);
        if (pSVar16 != (StackSym *)0x0) {
          Output::Print(L"[segLen: ");
          pSVar16 = ArrayRegOpnd::HeadSegmentLengthSym(this_06);
          Sym::Dump(&pSVar16->super_Sym,ValueType::Uninitialized);
          Output::Print(L"]");
        }
        pSVar16 = ArrayRegOpnd::LengthSym(this_06);
        if (pSVar16 != (StackSym *)0x0) {
          pSVar16 = ArrayRegOpnd::LengthSym(this_06);
          pSVar17 = ArrayRegOpnd::HeadSegmentLengthSym(this_06);
          if (pSVar16 != pSVar17) {
            Output::Print(L"[len: ");
            pSVar16 = ArrayRegOpnd::LengthSym(this_06);
            Sym::Dump(&pSVar16->super_Sym,ValueType::Uninitialized);
            Output::Print(L"]");
          }
        }
        bVar6 = ArrayRegOpnd::EliminatedLowerBoundCheck(this_06);
        if ((bVar6) || (bVar6 = ArrayRegOpnd::EliminatedUpperBoundCheck(this_06), bVar6)) {
          Output::Print(L"[");
          bVar6 = ArrayRegOpnd::EliminatedLowerBoundCheck(this_06);
          if (bVar6) {
            Output::Print(L">");
          }
          bVar6 = ArrayRegOpnd::EliminatedUpperBoundCheck(this_06);
          if (bVar6) {
            Output::Print(L"<");
          }
          Output::Print(L"]");
        }
      }
    }
    else {
      RVar3 = RegOpnd::GetReg(pRStack_40);
      Output::Print(L"%S",RegNames[RVar3]);
    }
    break;
  case OpndKindAddr:
    DumpOpndKindAddr(this,(bool)(floatValue._7_1_ & 1),pFStack_20);
    break;
  case OpndKindIndir:
    this_07 = AsIndirOpnd(this);
    this_08 = IndirOpnd::GetBaseOpnd(this_07);
    this_09 = IndirOpnd::GetIndexOpnd(this_07);
    uVar9 = IndirOpnd::GetOffset(this_07);
    Output::Print(L"[");
    if (this_08 == (RegOpnd *)0x0) {
      Output::Print(L"<null>");
    }
    else {
      Dump(&this_08->super_Opnd,func_local._4_4_,pFStack_20);
    }
    if (this_09 != (RegOpnd *)0x0) {
      Output::Print(L"+");
      Dump(&this_09->super_Opnd,func_local._4_4_,pFStack_20);
      bVar4 = IndirOpnd::GetScale(this_07);
      if (bVar4 != '\0') {
        bVar5 = IndirOpnd::GetScale(this_07);
        Output::Print(L"*%d",(ulong)(uint)(1 << (bVar5 & 0x1f)));
      }
    }
    if (uVar9 != 0) {
      if (((DAT_01ea40f8 & 1) == 0) && (bVar6 = IndirOpnd::HasAddrKind(this_07), bVar6)) {
        Output::Print(L"+XX");
      }
      else {
        pcVar12 = L"";
        if (-1 < (int)uVar9) {
          pcVar12 = L"+";
        }
        if ((floatValue._7_1_ & 1) == 0) {
          Output::Print(L"%s%d",pcVar12,(ulong)uVar9);
        }
        else {
          Output::Print(L"%sXXXX%04d",pcVar12,(ulong)(uVar9 & 0xffff));
        }
      }
    }
    pcVar24 = IndirOpnd::GetDescription(this_07);
    if (pcVar24 != (char16 *)0x0) {
      pcVar24 = IndirOpnd::GetDescription(this_07);
      Output::Print(L" <%s>",pcVar24);
    }
    bVar6 = IndirOpnd::HasAddrKind(this_07);
    if (bVar6) {
      pvVar25 = IndirOpnd::GetOriginalAddress(this_07);
      Output::Print(L" <");
      addressKind = IndirOpnd::GetAddrKind(this_07);
      GetAddrDescription((char16 *)&list,0x80,pvVar25,addressKind,(bool)(floatValue._7_1_ & 1),true,
                         pFStack_20,true);
      Output::Print(L"%s",&list);
      Output::Print(L">");
    }
    Output::Print(L"]");
    break;
  case OpndKindLabel:
    this_11 = AsLabelOpnd(this);
    pLVar26 = LabelOpnd::GetLabel(this_11);
    if (pLVar26 == (LabelInstr *)0x0) {
      Output::Print(L"??");
    }
    else {
      Output::Print(L"&$L%d",(ulong)pLVar26->m_id);
    }
    break;
  case OpndKindMemRef:
    DumpOpndKindMemRef(this,(bool)(floatValue._7_1_ & 1),pFStack_20);
    break;
  case OpndKindRegBV:
    pRVar20 = AsRegBVOpnd(this);
    BVUnitT<unsigned_long>::Dump(&pRVar20->m_value,0,false);
    break;
  case OpndKindList:
    this_10 = AsListOpnd(this);
    Output::Print(L"{");
    iVar10 = ListOpnd::Count(this_10);
    function._4_4_ = labelOpnd._4_4_;
    function.flags = func_local._4_4_;
    function._20_4_ = uStack_25c;
    function.count = iVar10;
    function.func._0_4_ = (int)pFStack_20;
    function.func._4_4_ = (int)((ulong)pFStack_20 >> 0x20);
    ListOpnd::Map<IR::Opnd::Dump(IRDumpFlags,Func*)::__0>(this_10,function);
    Output::Print(L"}");
  }
  if (((floatValue._7_1_ & 1) == 0) && ((local_45 & 1) != 0)) {
    DumpValueType(this);
  }
  if (((floatValue._6_1_ & 1) == 0) || (IVar7 = GetType(this), IVar7 != TyVar)) {
    Output::Print(L".");
    IVar7 = GetType(this);
    IRType_Dump(IVar7);
  }
  if ((((byte)this->field_0xb >> 2 & 1) != 0) && ((floatValue._6_1_ & 1) == 0)) {
    Output::Print(L"!");
  }
  return;
}

Assistant:

void
Opnd::Dump(IRDumpFlags flags, Func *func)
{
    bool const AsmDumpMode = flags & IRDumpFlags_AsmDumpMode;
    bool const SimpleForm = !!(flags & IRDumpFlags_SimpleForm);
    FloatConstType floatValue;
    SymOpnd * symOpnd;
    RegOpnd * regOpnd;
    JnHelperMethod helperMethod;
    bool dumpValueType = !SimpleForm;

    switch(GetKind())
    {
    case OpndKindSym:
        symOpnd = this->AsSymOpnd();
        if(symOpnd->m_sym->IsPropertySym() && !SimpleForm)
        {
            symOpnd->m_sym->Dump(flags, symOpnd->GetPropertyOwnerValueType());
        }
        else
        {
            symOpnd->m_sym->Dump(flags);
        }

        if (symOpnd->m_sym->IsStackSym())
        {
            StackSym * stackSym = symOpnd->m_sym->AsStackSym();
            bool hasOffset = stackSym->IsArgSlotSym()?
                ((stackSym->m_offset != -1) || !stackSym->m_isInlinedArgSlot) :
                (stackSym->m_offset != 0);
            if (hasOffset)
            {
                int offset = stackSym->m_offset;
                if(symOpnd->m_offset != 0)
                {
                    Assert(static_cast<int>(offset + symOpnd->m_offset) >= offset);
                    offset += symOpnd->m_offset;
                }
                Output::Print(_u("<%d>"), offset);
            }
        }
        else if (symOpnd->IsPropertySymOpnd() && !SimpleForm)
        {
            PropertySymOpnd *propertySymOpnd = symOpnd->AsPropertySymOpnd();
            Output::Print(_u("<"));
            if (propertySymOpnd->HasObjTypeSpecFldInfo())
            {
                Output::Print(_u("%u,%s%s%s%s,"), propertySymOpnd->GetObjTypeSpecFldId(), propertySymOpnd->IsPoly() ? _u("p") : _u("m"),
                    propertySymOpnd->IsLoadedFromProto() ? _u("~") : _u(""), propertySymOpnd->UsesFixedValue() ? _u("=") : _u(""),
                    propertySymOpnd->IsBeingAdded() ? _u("+") : _u(""));
            }
            else
            {
                Output::Print(_u("?,,"));
            }
            Output::Print(_u("%s%s,"), propertySymOpnd->MayNeedTypeCheckProtection() ?
                propertySymOpnd->IsMono() ? _u("+") : _u("=") :
                propertySymOpnd->IsRootObjectNonConfigurableFieldLoad() ? _u("~") : _u("-"),
                propertySymOpnd->IsTypeCheckSeqCandidate() ? _u("+") : _u("-"));
            if (propertySymOpnd->HasObjectTypeSym())
            {
                Output::Print(_u("s%d"), propertySymOpnd->GetObjectTypeSym()->m_id);
                if (propertySymOpnd->IsTypeChecked())
                {
                    Output::Print(_u("+%s"), propertySymOpnd->IsMono() ? _u("m") : _u("p"));
                }
                else if (propertySymOpnd->IsTypeAvailable())
                {
                    Output::Print(_u("*"));
                }
                if (propertySymOpnd->IsTypeDead())
                {
                    Output::Print(_u("!"));
                }
            }
            else
            {
                Output::Print(_u("s?"));
            }
            if (propertySymOpnd->m_sym->AsPropertySym()->m_writeGuardSym != nullptr)
            {
                Output::Print(_u(",s%d"), propertySymOpnd->m_sym->AsPropertySym()->m_writeGuardSym->m_id);
                if (propertySymOpnd->IsWriteGuardChecked())
                {
                    Output::Print(_u("+"));
                }
            }
            else
            {
                Output::Print(_u(",s?"));
            }
            if (propertySymOpnd->HasFinalType())
            {
                Output::Print(_u(",final:"));
                this->DumpAddress((void*)propertySymOpnd->GetFinalType()->GetAddr(), /* printToConsole */ true, /* skipMaskedAddress */ false);
            }
            if (propertySymOpnd->GetGuardedPropOps() != nullptr)
            {
                Output::Print(_u(",{"));
                if (func != nullptr)
                {
                    int i = 0;
                    auto guardedPropOps = propertySymOpnd->GetGuardedPropOps();
                    FOREACH_BITSET_IN_SPARSEBV(propertyOpId, guardedPropOps)
                    {
                        if (i++ > 0)
                        {
                            Output::Print(_u(","));
                        }
                        const ObjTypeSpecFldInfo* propertyOpInfo = func->GetTopFunc()->GetGlobalObjTypeSpecFldInfo(propertyOpId);
                        if (!JITManager::GetJITManager()->IsOOPJITEnabled())
                        {
                            Output::Print(_u("%s"), func->GetInProcThreadContext()->GetPropertyRecord(propertyOpInfo->GetPropertyId())->GetBuffer(), propertyOpId);
                        }
                        Output::Print(_u("(%u)"), propertyOpId);

                        if (propertyOpInfo->IsLoadedFromProto())
                        {
                            Output::Print(_u("~"));
                        }
                        if (propertyOpInfo->HasFixedValue())
                        {
                            Output::Print(_u("="));
                        }
                        if (propertyOpInfo->IsBeingAdded())
                        {
                            Output::Print(_u("+"));
                        }
                    }
                    NEXT_BITSET_IN_SPARSEBV;
                }
                else
                {
                    Output::Print(_u("(no func)"));
                }
                Output::Print(_u("}"));
            }
            if (propertySymOpnd->GetWriteGuards() != nullptr)
            {
                Output::Print(_u(",{"));
                int i = 0;
                auto writeGuards = propertySymOpnd->GetWriteGuards();
                FOREACH_BITSET_IN_SPARSEBV(writeGuardSymId, writeGuards)
                {
                    if (i++ > 0)
                    {
                        Output::Print(_u(","));
                    }
                    Output::Print(_u("s%d"), writeGuardSymId);
                }
                NEXT_BITSET_IN_SPARSEBV;
                Output::Print(_u("}"));
            }
            if (propertySymOpnd->canStoreTemp)
            {
                Output::Print(_u(",t"));
            }
            Output::Print(_u(">"));
        }

        break;

    case OpndKindReg:
        regOpnd = this->AsRegOpnd();
        if (regOpnd->m_sym)
        {
            regOpnd->m_sym->Dump(flags);
        }
        if(AsmDumpMode)
        {
            //
            // Print no brackets
            //
            Output::Print(_u("%S"), RegNames[regOpnd->GetReg()]);
        }
        else
        {
            if (regOpnd->GetReg() != RegNOREG)
            {
                Output::Print(_u("(%S)"), RegNames[regOpnd->GetReg()]);
            }
            if (regOpnd->m_isTempLastUse)
            {
                Output::Print(_u("[isTempLastUse]"));
            }

            if(regOpnd->IsArrayRegOpnd())
            {
                if(dumpValueType)
                {
                    // Dump the array value type before the associated syms
                    DumpValueType();
                    dumpValueType = false;
                }

                const ArrayRegOpnd *const arrayRegOpnd = regOpnd->AsArrayRegOpnd();
                if(arrayRegOpnd->HeadSegmentSym())
                {
                    Output::Print(_u("[seg: "));
                    arrayRegOpnd->HeadSegmentSym()->Dump();
                    Output::Print(_u("]"));
                }
                if(arrayRegOpnd->HeadSegmentLengthSym())
                {
                    Output::Print(_u("[segLen: "));
                    arrayRegOpnd->HeadSegmentLengthSym()->Dump();
                    Output::Print(_u("]"));
                }
                if(arrayRegOpnd->LengthSym() && arrayRegOpnd->LengthSym() != arrayRegOpnd->HeadSegmentLengthSym())
                {
                    Output::Print(_u("[len: "));
                    arrayRegOpnd->LengthSym()->Dump();
                    Output::Print(_u("]"));
                }
                if(arrayRegOpnd->EliminatedLowerBoundCheck() || arrayRegOpnd->EliminatedUpperBoundCheck())
                {
                    Output::Print(_u("["));
                    if(arrayRegOpnd->EliminatedLowerBoundCheck())
                    {
                        Output::Print(_u(">"));
                    }
                    if(arrayRegOpnd->EliminatedUpperBoundCheck())
                    {
                        Output::Print(_u("<"));
                    }
                    Output::Print(_u("]"));
                }
            }
        }
        break;

    case OpndKindInt64Const:
    {
        Int64ConstOpnd * intConstOpnd = this->AsInt64ConstOpnd();
        intConstOpnd->DumpEncodable();
        break;
    }
    case OpndKindIntConst:
    {
        IntConstOpnd * intConstOpnd = this->AsIntConstOpnd();
        intConstOpnd->DumpEncodable();
        break;
    }

    case OpndKindRegBV:
    {
        RegBVOpnd * regBVOpnd = this->AsRegBVOpnd();
        regBVOpnd->m_value.Dump();
        break;
    }

    case OpndKindHelperCall:
        helperMethod = this->AsHelperCallOpnd()->m_fnHelper;
        Output::Print(_u("%s"), IR::GetMethodName(helperMethod));
        break;

    case OpndKindFloatConst:
        floatValue = this->AsFloatConstOpnd()->m_value;
        Output::Print(_u("%G"), floatValue);
        break;

    case OpndKindFloat32Const:
        Output::Print(_u("%G"), this->AsFloat32ConstOpnd()->m_value);
        break;

    case OpndKindAddr:
        DumpOpndKindAddr(AsmDumpMode, func);
        break;

    case OpndKindIndir:
    {
        IndirOpnd * indirOpnd = this->AsIndirOpnd();
        RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();
        RegOpnd * indexOpnd = indirOpnd->GetIndexOpnd();
        const int32 offset = indirOpnd->GetOffset();

        Output::Print(_u("["));
        if (baseOpnd != nullptr)
        {
            baseOpnd->Dump(flags, func);
        }
        else
        {
            Output::Print(_u("<null>"));
        }

        if (indexOpnd != nullptr)
        {
            Output::Print(_u("+"));
            indexOpnd->Dump(flags, func);
            if (indirOpnd->GetScale() > 0)
            {
                Output::Print(_u("*%d"), 1 << indirOpnd->GetScale());
            }
        }
        if (offset != 0)
        {
            if (!Js::Configuration::Global.flags.DumpIRAddresses && indirOpnd->HasAddrKind())
            {
                Output::Print(_u("+XX"));
            }
            else
            {
                const auto sign = offset >= 0 ? _u("+") : _u("");
                if (AsmDumpMode)
                {
                    Output::Print(_u("%sXXXX%04d"), sign, offset & 0xffff);
                }
                else
                {
                    Output::Print(_u("%s%d"), sign, offset);
                }
            }
        }
        if (indirOpnd->GetDescription())
        {
            Output::Print(_u(" <%s>"), indirOpnd->GetDescription());
        }
        if (indirOpnd->HasAddrKind())
        {
            INT_PTR address = (INT_PTR)indirOpnd->GetOriginalAddress();
            Output::Print(_u(" <"));
            const size_t BUFFER_LEN = 128;
            char16 buffer[BUFFER_LEN];
            GetAddrDescription(buffer, BUFFER_LEN, (void *)address, indirOpnd->GetAddrKind(), AsmDumpMode, /*printToConsole */ true, func, /* skipMaskedAddress */true);
            Output::Print(_u("%s"), buffer);
            Output::Print(_u(">"));
        }

        Output::Print(_u("]"));
        break;
    }
    case IR::OpndKindList:
    {
        IR::ListOpnd* list = this->AsListOpnd();
        Output::Print(_u("{"));
        int count = list->Count();
        list->Map([flags, func, count](int i, IR::Opnd* opnd)
        {
            opnd->Dump(flags, func);
            if (i + 1 < count)
            {
                Output::Print(_u(","));
            }
        });
        Output::Print(_u("}"));
        break;
    }
    case OpndKindMemRef:
    {
        DumpOpndKindMemRef(AsmDumpMode, func);
        break;
    }
    case OpndKindLabel:
    {
        LabelOpnd * labelOpnd = this->AsLabelOpnd();
        LabelInstr * labelInstr = labelOpnd->GetLabel();
        if (labelInstr == nullptr)
        {
            Output::Print(_u("??"));
        }
        else
        {
            Output::Print(_u("&$L%d"), labelInstr->m_id);
        }
        break;
    }
    }

    if(!AsmDumpMode && dumpValueType)
    {
        DumpValueType();
    }
    if (!SimpleForm || this->GetType() != TyVar)
    {
        Output::Print(_u("."));
        IRType_Dump(this->GetType());
    }
    if (this->m_isDead && !SimpleForm)
    {
        Output::Print(_u("!"));
    }
}